

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O3

void Ga2_ManReportMemory(Ga2_Man_t *p)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Vec_Ptr_t *pVVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  long lVar12;
  int level;
  Rnm_Man_t *p_00;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  undefined4 local_118;
  undefined4 local_108;
  undefined4 local_f8;
  undefined4 local_e8;
  undefined4 local_b8;
  undefined4 local_a8;
  
  pVVar2 = p->pGia->vMapping;
  dVar4 = 0.0;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    dVar4 = (double)pVVar2->nCap * 4.0 + 16.0;
  }
  iVar1 = p->pGia->nObjsAlloc;
  dVar5 = sat_solver2_memory(p->pSat,1);
  dVar6 = sat_solver2_memory_proof(p->pSat);
  pVVar3 = p->vId2Lit;
  dVar8 = 0.0;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    dVar8 = (double)pVVar3->nCap * 8.0 + 16.0;
    if (0 < (long)pVVar3->nSize) {
      lVar12 = 0;
      do {
        if ((int *)pVVar3->pArray[lVar12] != (int *)0x0) {
          dVar8 = dVar8 + (double)*pVVar3->pArray[lVar12] * 4.0 + 16.0;
        }
        lVar12 = lVar12 + 1;
      } while (pVVar3->nSize != lVar12);
    }
  }
  p_00 = p->pRnm;
  dVar7 = Rnm_ManMemoryUsage(p_00);
  level = (int)p_00;
  pVVar3 = p->vCnfs;
  dVar13 = 0.0;
  dVar11 = 0.0;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    dVar11 = (double)pVVar3->nCap * 8.0 + 16.0;
    if (0 < (long)pVVar3->nSize) {
      lVar12 = 0;
      do {
        if ((int *)pVVar3->pArray[lVar12] != (int *)0x0) {
          dVar11 = dVar11 + (double)*pVVar3->pArray[lVar12] * 4.0 + 16.0;
        }
        lVar12 = lVar12 + 1;
      } while (pVVar3->nSize != lVar12);
    }
  }
  if (p->vIds != (Vec_Int_t *)0x0) {
    dVar13 = (double)p->vIds->nCap * 4.0 + 16.0;
  }
  dVar14 = 0.0;
  dVar17 = 0.0;
  if (p->vProofIds != (Vec_Int_t *)0x0) {
    dVar17 = (double)p->vProofIds->nCap * 4.0 + 16.0;
  }
  if (p->vAbs != (Vec_Int_t *)0x0) {
    dVar14 = (double)p->vAbs->nCap * 4.0 + 16.0;
  }
  dVar9 = 0.0;
  dVar10 = 0.0;
  if (p->vValues != (Vec_Int_t *)0x0) {
    dVar10 = (double)p->vValues->nCap * 4.0 + 16.0;
  }
  if (p->vLits != (Vec_Int_t *)0x0) {
    dVar9 = (double)p->vLits->nCap * 4.0 + 16.0;
  }
  dVar16 = 0.0;
  if (p->vIsopMem != (Vec_Int_t *)0x0) {
    dVar16 = (double)p->vIsopMem->nCap * 4.0 + 16.0;
  }
  lVar12 = (long)p->nTable * 0x18;
  auVar15._8_4_ = (int)((ulong)lVar12 >> 0x20);
  auVar15._0_8_ = lVar12;
  auVar15._12_4_ = 0x45300000;
  dVar18 = (auVar15._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0);
  dVar4 = (double)iVar1 * 12.0 + dVar4;
  dVar13 = dVar16 + dVar9 + dVar10 + dVar14 + dVar11 + 224.0 + dVar13 + dVar17 + 926274.0;
  dVar11 = dVar18 + dVar7 + dVar8 + dVar6 + dVar5 + dVar4 + dVar13;
  Abc_Print(level,"%s =","Memory: AIG      ");
  dVar14 = (dVar4 * 100.0) / dVar11;
  if ((dVar11 == 0.0) && (!NAN(dVar11))) {
    dVar14 = 0.0;
  }
  dVar17 = (dVar11 * 100.0) / dVar11;
  if ((dVar11 == 0.0) && (!NAN(dVar11))) {
    dVar17 = 0.0;
  }
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",SUB84(dVar4 * 9.5367431640625e-07,0),dVar14);
  Abc_Print(level,"%s =","Memory: SAT      ");
  local_108 = SUB84(dVar5 * 9.5367431640625e-07,0);
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",local_108);
  Abc_Print(level,"%s =","Memory: Proof    ");
  local_f8 = SUB84(dVar6 * 9.5367431640625e-07,0);
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",local_f8);
  Abc_Print(level,"%s =","Memory: Map      ");
  local_e8 = SUB84(dVar8 * 9.5367431640625e-07,0);
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",local_e8);
  Abc_Print(level,"%s =","Memory: Refine   ");
  local_118 = SUB84(dVar7 * 9.5367431640625e-07,0);
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",local_118);
  Abc_Print(level,"%s =","Memory: Hash     ");
  local_a8 = SUB84(dVar18 * 9.5367431640625e-07,0);
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",local_a8);
  Abc_Print(level,"%s =","Memory: Other    ");
  local_b8 = SUB84(dVar13 * 9.5367431640625e-07,0);
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",local_b8);
  Abc_Print(level,"%s =","Memory: TOTAL    ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",SUB84(dVar11 * 9.5367431640625e-07,0),dVar17);
  return;
}

Assistant:

void Ga2_ManReportMemory( Ga2_Man_t * p )
{
    double memTot = 0;
    double memAig = 1.0 * p->pGia->nObjsAlloc * sizeof(Gia_Obj_t) + Vec_IntMemory(p->pGia->vMapping);
    double memSat = sat_solver2_memory( p->pSat, 1 );
    double memPro = sat_solver2_memory_proof( p->pSat );
    double memMap = Vec_VecMemoryInt( (Vec_Vec_t *)p->vId2Lit );
    double memRef = Rnm_ManMemoryUsage( p->pRnm );
    double memHash= sizeof(int) * 6 * p->nTable;
    double memOth = sizeof(Ga2_Man_t);
    memOth += Vec_VecMemoryInt( (Vec_Vec_t *)p->vCnfs );
    memOth += Vec_IntMemory( p->vIds );
    memOth += Vec_IntMemory( p->vProofIds );
    memOth += Vec_IntMemory( p->vAbs );
    memOth += Vec_IntMemory( p->vValues );
    memOth += Vec_IntMemory( p->vLits );
    memOth += Vec_IntMemory( p->vIsopMem );
    memOth += 336450 + (sizeof(char) + sizeof(char*)) * 65536;
    memTot = memAig + memSat + memPro + memMap + memRef + memHash + memOth;
    ABC_PRMP( "Memory: AIG      ", memAig, memTot );
    ABC_PRMP( "Memory: SAT      ", memSat, memTot );
    ABC_PRMP( "Memory: Proof    ", memPro, memTot );
    ABC_PRMP( "Memory: Map      ", memMap, memTot );
    ABC_PRMP( "Memory: Refine   ", memRef, memTot );
    ABC_PRMP( "Memory: Hash     ", memHash,memTot );
    ABC_PRMP( "Memory: Other    ", memOth, memTot );
    ABC_PRMP( "Memory: TOTAL    ", memTot, memTot );
}